

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall TextReaderTest_ReadString_Test::TestBody(TextReaderTest_ReadString_Test *this)

{
  NLStringRef data;
  bool bVar1;
  StringRef SVar2;
  ReadError *e_3;
  bool gtest_caught_expected_3;
  string gtest_expected_message_3;
  AssertionResult gtest_ar_4;
  ReadError *e_2;
  bool gtest_caught_expected_2;
  string gtest_expected_message_2;
  AssertionResult gtest_ar_3;
  ReadError *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_2;
  ReadError *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  StringRef name;
  TextReader reader;
  char *in_stack_fffffffffffffbd8;
  TextReader<fmt::Locale> *in_stack_fffffffffffffbe0;
  char (*in_stack_fffffffffffffbe8) [4];
  char *in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf8;
  int in_stack_fffffffffffffbfc;
  TextReader<fmt::Locale> *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  Type in_stack_fffffffffffffc0c;
  CStringRef in_stack_fffffffffffffc10;
  BasicStringRef<char> *in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  Message *in_stack_fffffffffffffc58;
  TextReader<fmt::Locale> *in_stack_fffffffffffffc60;
  allocator<char> local_249;
  string local_248 [32];
  AssertionResult local_228 [3];
  StringRef local_1f8;
  byte local_1e2;
  allocator<char> local_1e1;
  string local_1e0 [32];
  AssertionResult local_1c0 [3];
  StringRef local_190;
  byte local_17a;
  allocator<char> local_179;
  string local_178 [32];
  AssertionResult local_158 [3];
  int local_124;
  StringRef local_120;
  byte local_10a;
  allocator<char> local_109;
  string local_108 [32];
  AssertionResult local_e8 [2];
  string local_c8 [32];
  AssertionResult local_a8 [2];
  StringRef local_88;
  BasicCStringRef<char> local_78 [15];
  
  mp::NLStringRef::NLStringRef((NLStringRef *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  fmt::BasicCStringRef<char>::BasicCStringRef(local_78,"test");
  data.size_._0_7_ = in_stack_fffffffffffffc20;
  data.data_ = (char *)in_stack_fffffffffffffc18;
  data.size_._7_1_ = in_stack_fffffffffffffc27;
  mp::internal::TextReader<fmt::Locale>::TextReader
            ((TextReader<fmt::Locale> *)
             CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),data,
             in_stack_fffffffffffffc10);
  local_88 = mp::internal::TextReader<fmt::Locale>::ReadString(in_stack_fffffffffffffc60);
  fmt::BasicStringRef<char>::to_string_abi_cxx11_(in_stack_fffffffffffffc18);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
             in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbe0);
  std::__cxx11::string::~string(local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc10.data_);
    testing::AssertionResult::failure_message((AssertionResult *)0x13f03f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffc10.data_,in_stack_fffffffffffffc0c,
               (char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf0
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
    testing::Message::~Message((Message *)0x13f0a2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13f0fa);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
               (char *)in_stack_fffffffffffffc18,(allocator<char> *)in_stack_fffffffffffffc10.data_)
    ;
    std::allocator<char>::~allocator(&local_109);
    local_10a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_120 = mp::internal::TextReader<fmt::Locale>::ReadString(in_stack_fffffffffffffc60);
    }
    if ((local_10a & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffc10.data_,
                 (char (*) [102])CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
      local_124 = 2;
    }
    else {
      local_124 = 0;
    }
    std::__cxx11::string::~string(local_108);
    if (local_124 != 0) goto LAB_0013f4a3;
  }
  else {
LAB_0013f4a3:
    testing::Message::Message((Message *)in_stack_fffffffffffffc10.data_);
    testing::AssertionResult::failure_message((AssertionResult *)0x13f4bf);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffc10.data_,in_stack_fffffffffffffc0c,
               (char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf0
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
    testing::Message::~Message((Message *)0x13f522);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13f57a);
  mp::internal::TextReader<fmt::Locale>::ReadTillEndOfLine(in_stack_fffffffffffffc00);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_158);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
               (char *)in_stack_fffffffffffffc18,(allocator<char> *)in_stack_fffffffffffffc10.data_)
    ;
    std::allocator<char>::~allocator(&local_179);
    local_17a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_190 = mp::internal::TextReader<fmt::Locale>::ReadString(in_stack_fffffffffffffc60);
    }
    if ((local_17a & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffc10.data_,
                 (char (*) [102])CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
      local_124 = 3;
    }
    else {
      local_124 = 0;
    }
    std::__cxx11::string::~string(local_178);
    if (local_124 != 0) goto LAB_0013f932;
  }
  else {
LAB_0013f932:
    testing::Message::Message((Message *)in_stack_fffffffffffffc10.data_);
    testing::AssertionResult::failure_message((AssertionResult *)0x13f94e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffc10.data_,in_stack_fffffffffffffc0c,
               (char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf0
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
    testing::Message::~Message((Message *)0x13f9b1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13fa09);
  mp::internal::TextReader<fmt::Locale>::ReadTillEndOfLine(in_stack_fffffffffffffc00);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
               (char *)in_stack_fffffffffffffc18,(allocator<char> *)in_stack_fffffffffffffc10.data_)
    ;
    std::allocator<char>::~allocator(&local_1e1);
    local_1e2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_1f8 = mp::internal::TextReader<fmt::Locale>::ReadString(in_stack_fffffffffffffc60);
    }
    if ((local_1e2 & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffc10.data_,
                 (char (*) [102])CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
      local_124 = 4;
    }
    else {
      local_124 = 0;
    }
    std::__cxx11::string::~string(local_1e0);
    if (local_124 != 0) goto LAB_0013fdaf;
  }
  else {
LAB_0013fdaf:
    testing::Message::Message((Message *)in_stack_fffffffffffffc10.data_);
    testing::AssertionResult::failure_message((AssertionResult *)0x13fdcb);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffc10.data_,in_stack_fffffffffffffc0c,
               (char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf0
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
    testing::Message::~Message((Message *)0x13fe28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13fe80);
  mp::internal::TextReader<fmt::Locale>::ReadTillEndOfLine(in_stack_fffffffffffffc00);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_228);
  SVar2.size_ = (size_t)in_stack_fffffffffffffc10.data_;
  SVar2.data_ = (char *)in_stack_fffffffffffffc18;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
               (char *)in_stack_fffffffffffffc18,(allocator<char> *)in_stack_fffffffffffffc10.data_)
    ;
    std::allocator<char>::~allocator(&local_249);
    bVar1 = testing::internal::AlwaysTrue();
    SVar2.size_ = (size_t)in_stack_fffffffffffffc10.data_;
    SVar2.data_ = (char *)in_stack_fffffffffffffc18;
    if (bVar1) {
      SVar2 = mp::internal::TextReader<fmt::Locale>::ReadString(in_stack_fffffffffffffc60);
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)SVar2.size_,
               (char (*) [102])CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
    local_124 = 5;
    std::__cxx11::string::~string(local_248);
    if (local_124 == 0) goto LAB_001402b5;
  }
  testing::Message::Message((Message *)SVar2.size_);
  testing::AssertionResult::failure_message((AssertionResult *)0x140212);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)SVar2.size_,in_stack_fffffffffffffc0c,(char *)in_stack_fffffffffffffc00
             ,in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf0);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
  testing::Message::~Message((Message *)0x14026d);
LAB_001402b5:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1402c2);
  mp::internal::TextReader<fmt::Locale>::~TextReader(in_stack_fffffffffffffbe0);
  return;
}

Assistant:

TEST(TextReaderTest, ReadString) {
  TextReader reader("  3:a\nb\nc\n2x\n2:de \n2:fg", "test");
  fmt::StringRef name = reader.ReadString();
  EXPECT_EQ("a\nb", name.to_string());
  EXPECT_THROW_MSG(reader.ReadString(), mp::ReadError,
                   "test:3:1: expected unsigned integer");
  reader.ReadTillEndOfLine();
  EXPECT_THROW_MSG(reader.ReadString(), mp::ReadError,
                   "test:4:2: expected ':'");
  reader.ReadTillEndOfLine();
  EXPECT_THROW_MSG(reader.ReadString(), mp::ReadError,
                   "test:5:5: expected newline");
  reader.ReadTillEndOfLine();
  EXPECT_THROW_MSG(reader.ReadString(), mp::ReadError,
                   "test:6:5: expected newline");
}